

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int j_1;
  uint blocklen;
  uint s2;
  uint s1;
  uint i_1;
  int d_1;
  int e;
  int d;
  int n;
  uchar **hlist;
  uchar *bestloc;
  int best;
  int h;
  uchar **hash_table [16384];
  uchar *out;
  int bitcount;
  int j;
  int i;
  uint bitbuf;
  uint *in_stack_fffffffffffdff68;
  uchar **in_stack_fffffffffffdff70;
  int iStack_2007c;
  int in_stack_fffffffffffdff88;
  int in_stack_fffffffffffdff8c;
  undefined4 in_stack_fffffffffffdff90;
  undefined4 in_stack_fffffffffffdff94;
  uint uStack_20068;
  uint uStack_20064;
  long lStack_20048;
  uint uStack_20040;
  long alStack_20038 [16384];
  uchar *local_38;
  int local_2c;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  int *local_18;
  int local_c;
  long local_8;
  
  local_20 = 0;
  local_2c = 0;
  local_38 = (uchar *)0x0;
  local_1c = in_ECX;
  if (in_ECX < 5) {
    local_1c = 5;
  }
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  stbiw__sbgrowf((void **)CONCAT44(in_stack_fffffffffffdff94,in_stack_fffffffffffdff90),
                 in_stack_fffffffffffdff8c,in_stack_fffffffffffdff88);
  iVar4 = *(int *)(local_38 + -4);
  *(int *)(local_38 + -4) = iVar4 + 1;
  local_38[iVar4] = 'x';
  if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
    stbiw__sbgrowf((void **)CONCAT44(in_stack_fffffffffffdff94,in_stack_fffffffffffdff90),
                   in_stack_fffffffffffdff8c,in_stack_fffffffffffdff88);
  }
  iVar4 = *(int *)(local_38 + -4);
  *(int *)(local_38 + -4) = iVar4 + 1;
  local_38[iVar4] = '^';
  local_20 = 1 << ((byte)local_2c & 0x1f) | local_20;
  local_2c = local_2c + 1;
  local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                (int *)0x1102e6);
  local_20 = 1 << ((byte)local_2c & 0x1f) | local_20;
  local_2c = local_2c + 2;
  local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                (int *)0x110338);
  for (local_24 = 0; local_24 < 0x4000; local_24 = local_24 + 1) {
    alStack_20038[local_24] = 0;
  }
  local_24 = 0;
  do {
    if (local_c + -3 <= local_24) {
      for (; local_24 < local_c; local_24 = local_24 + 1) {
        if (*(byte *)(local_8 + local_24) < 0x90) {
          iVar4 = stbiw__zlib_bitrev(*(byte *)(local_8 + local_24) + 0x30,8);
          local_20 = iVar4 << ((byte)local_2c & 0x1f) | local_20;
          local_2c = local_2c + 8;
          local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68
                                        ,(int *)0x110d0d);
        }
        else {
          iVar4 = stbiw__zlib_bitrev(*(byte *)(local_8 + local_24) + 0x100,9);
          local_20 = iVar4 << ((byte)local_2c & 0x1f) | local_20;
          local_2c = local_2c + 9;
          local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68
                                        ,(int *)0x110d86);
        }
      }
      iVar4 = stbiw__zlib_bitrev(0,7);
      local_20 = iVar4 << ((byte)local_2c & 0x1f) | local_20;
      local_2c = local_2c + 7;
      local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                    (int *)0x110df5);
      while (local_2c != 0) {
        local_20 = 0 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 1;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                      (int *)0x110e4e);
      }
      for (local_24 = 0; local_24 < 0x4000; local_24 = local_24 + 1) {
        if (alStack_20038[local_24] != 0) {
          free((void *)(alStack_20038[local_24] + -8));
        }
      }
      uStack_20068 = 1;
      uVar3 = 0;
      iVar4 = 0;
      uVar2 = local_c % 0x15b0;
      while (iVar4 < local_c) {
        for (uStack_20064 = 0; uStack_20064 < uVar2; uStack_20064 = uStack_20064 + 1) {
          uStack_20068 = *(byte *)(local_8 + (ulong)(iVar4 + uStack_20064)) + uStack_20068;
          uVar3 = uStack_20068 + uVar3;
        }
        uStack_20068 = uStack_20068 % 0xfff1;
        uVar3 = uVar3 % 0xfff1;
        iVar4 = uVar2 + iVar4;
        uVar2 = 0x15b0;
      }
      if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
        stbiw__sbgrowf((void **)CONCAT44(uVar3,uVar2),iVar4,in_stack_fffffffffffdff88);
      }
      iVar5 = *(int *)(local_38 + -4);
      *(int *)(local_38 + -4) = iVar5 + 1;
      local_38[iVar5] = (uchar)(uVar3 >> 8);
      if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
        stbiw__sbgrowf((void **)CONCAT44(uVar3,uVar2),iVar4,in_stack_fffffffffffdff88);
      }
      iVar5 = *(int *)(local_38 + -4);
      *(int *)(local_38 + -4) = iVar5 + 1;
      local_38[iVar5] = (uchar)uVar3;
      if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
        stbiw__sbgrowf((void **)CONCAT44(uVar3,uVar2),iVar4,in_stack_fffffffffffdff88);
      }
      iVar5 = *(int *)(local_38 + -4);
      *(int *)(local_38 + -4) = iVar5 + 1;
      local_38[iVar5] = (uchar)(uStack_20068 >> 8);
      if ((local_38 == (uchar *)0x0) || (*(int *)(local_38 + -8) <= *(int *)(local_38 + -4) + 1)) {
        stbiw__sbgrowf((void **)CONCAT44(uVar3,uVar2),iVar4,in_stack_fffffffffffdff88);
      }
      iVar4 = *(int *)(local_38 + -4);
      *(int *)(local_38 + -4) = iVar4 + 1;
      local_38[iVar4] = (uchar)uStack_20068;
      *local_18 = *(int *)(local_38 + -4);
      memmove(local_38 + -8,local_38,(long)*local_18);
      return local_38 + -8;
    }
    uVar2 = stbiw__zhash((uchar *)(local_8 + local_24));
    uVar2 = uVar2 & 0x3fff;
    uStack_20040 = 3;
    lStack_20048 = 0;
    lVar1 = alStack_20038[(int)uVar2];
    if (lVar1 == 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = *(int *)(lVar1 + -4);
    }
    in_stack_fffffffffffdff88 = iVar4;
    for (local_28 = 0; local_28 < iVar4; local_28 = local_28 + 1) {
      if (((long)(local_24 + -0x8000) < *(long *)(lVar1 + (long)local_28 * 8) - local_8) &&
         (uVar3 = stbiw__zlib_countm(*(uchar **)(lVar1 + (long)local_28 * 8),
                                     (uchar *)(local_8 + local_24),local_c - local_24),
         (int)uStack_20040 <= (int)uVar3)) {
        lStack_20048 = *(long *)(lVar1 + (long)local_28 * 8);
        uStack_20040 = uVar3;
      }
    }
    if ((alStack_20038[(int)uVar2] != 0) &&
       (*(int *)(alStack_20038[(int)uVar2] + -4) == local_1c * 2)) {
      memmove((void *)alStack_20038[(int)uVar2],
              (void *)(alStack_20038[(int)uVar2] + (long)local_1c * 8),(long)local_1c << 3);
      *(int *)(alStack_20038[(int)uVar2] + -4) = local_1c;
    }
    if ((alStack_20038[(int)uVar2] == 0) ||
       (*(int *)(alStack_20038[(int)uVar2] + -8) <= *(int *)(alStack_20038[(int)uVar2] + -4) + 1)) {
      stbiw__sbgrowf((void **)CONCAT44(in_stack_fffffffffffdff94,in_stack_fffffffffffdff90),
                     in_stack_fffffffffffdff8c,in_stack_fffffffffffdff88);
    }
    lVar1 = alStack_20038[(int)uVar2];
    iVar4 = *(int *)(alStack_20038[(int)uVar2] + -4);
    *(int *)(alStack_20038[(int)uVar2] + -4) = iVar4 + 1;
    *(long *)(lVar1 + (long)iVar4 * 8) = local_8 + local_24;
    if (lStack_20048 != 0) {
      uVar2 = stbiw__zhash((uchar *)(local_8 + local_24 + 1));
      lVar1 = alStack_20038[(int)(uVar2 & 0x3fff)];
      if (lVar1 == 0) {
        iStack_2007c = 0;
      }
      else {
        iStack_2007c = *(int *)(lVar1 + -4);
      }
      for (local_28 = 0; local_28 < iStack_2007c; local_28 = local_28 + 1) {
        if (((long)(local_24 + -0x7fff) < *(long *)(lVar1 + (long)local_28 * 8) - local_8) &&
           (uVar2 = stbiw__zlib_countm(*(uchar **)(lVar1 + (long)local_28 * 8),
                                       (uchar *)(local_8 + local_24 + 1),(local_c - local_24) + -1),
           (int)uStack_20040 < (int)uVar2)) {
          lStack_20048 = 0;
          break;
        }
      }
    }
    if (lStack_20048 == 0) {
      if (*(byte *)(local_8 + local_24) < 0x90) {
        iVar4 = stbiw__zlib_bitrev(*(byte *)(local_8 + local_24) + 0x30,8);
        local_20 = iVar4 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 8;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                      (int *)0x110bdf);
      }
      else {
        iVar4 = stbiw__zlib_bitrev(*(byte *)(local_8 + local_24) + 0x100,9);
        local_20 = iVar4 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 9;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                      (int *)0x110c58);
      }
      local_24 = local_24 + 1;
    }
    else {
      iVar4 = ((int)local_8 + local_24) - (int)lStack_20048;
      local_28 = 0;
      while ((int)(stbi_zlib_compress::lengthc[local_28 + 1] - 1) < (int)uStack_20040) {
        local_28 = local_28 + 1;
      }
      if (local_28 + 0x101 < 0x90) {
        iVar5 = stbiw__zlib_bitrev(local_28 + 0x131,8);
        local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 8;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                      (int *)0x1107cf);
      }
      else if (local_28 + 0x101 < 0x100) {
        iVar5 = stbiw__zlib_bitrev(local_28 + 0x201,9);
        local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
        local_2c = local_2c + 9;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                      (int *)0x11085b);
      }
      else {
        if (local_28 + 0x101 < 0x118) {
          iVar5 = stbiw__zlib_bitrev(local_28 + 1,7);
          local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
          local_2c = local_2c + 7;
          local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68
                                        ,(int *)0x1108ed);
        }
        else {
          iVar5 = stbiw__zlib_bitrev(local_28 + 0xa9,8);
          local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
          local_2c = local_2c + 8;
          local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68
                                        ,(int *)0x11096c);
        }
        in_stack_fffffffffffdff70 = &local_38;
      }
      if (stbi_zlib_compress::lengtheb[local_28] != '\0') {
        local_20 = uStack_20040 - stbi_zlib_compress::lengthc[local_28] << ((byte)local_2c & 0x1f) |
                   local_20;
        local_2c = (uint)stbi_zlib_compress::lengtheb[local_28] + local_2c;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                      (int *)0x110a13);
      }
      local_28 = 0;
      while ((int)(stbi_zlib_compress::distc[local_28 + 1] - 1) < iVar4) {
        local_28 = local_28 + 1;
      }
      iVar5 = stbiw__zlib_bitrev(local_28,5);
      local_20 = iVar5 << ((byte)local_2c & 0x1f) | local_20;
      local_2c = local_2c + 5;
      local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                    (int *)0x110ab4);
      if (stbi_zlib_compress::disteb[local_28] != '\0') {
        local_20 = iVar4 - (uint)stbi_zlib_compress::distc[local_28] << ((byte)local_2c & 0x1f) |
                   local_20;
        local_2c = (uint)stbi_zlib_compress::disteb[local_28] + local_2c;
        local_38 = stbiw__zlib_flushf((uchar *)in_stack_fffffffffffdff70,in_stack_fffffffffffdff68,
                                      (int *)0x110b3f);
      }
      local_24 = uStack_20040 + local_24;
    }
  } while( true );
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char **hash_table[stbiw__ZHASH]; // 64KB on the stack!
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);

   {
      // compute adler32 on input
      unsigned int i=0, s1=1, s2=0, blocklen = data_len % 5552;
      int j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, (unsigned char) (s2 >> 8));
      stbiw__sbpush(out, (unsigned char) s2);
      stbiw__sbpush(out, (unsigned char) (s1 >> 8));
      stbiw__sbpush(out, (unsigned char) s1);
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}